

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O1

int __thiscall Fl_Graphics_Driver::not_clipped(Fl_Graphics_Driver *this,int x,int y,int w,int h)

{
  Fl_Region p_Var1;
  int iVar2;
  int iVar3;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  iVar3 = 0;
  if (0 < h + y && (w + x != 0 && SCARRY4(w,x) == w + x < 0)) {
    p_Var1 = this->rstack[this->rstackptr];
    if (p_Var1 == (Fl_Region)0x0) {
      iVar3 = 1;
    }
    else {
      local_20 = h;
      local_1c = w;
      local_18 = y;
      local_14 = x;
      iVar2 = clip_to_short(&local_14,&local_18,&local_1c,&local_20);
      iVar3 = 0;
      if (iVar2 == 0) {
        iVar3 = XRectInRegion(p_Var1,local_14,local_18,local_1c,local_20);
        return iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

int Fl_Graphics_Driver::not_clipped(int x, int y, int w, int h) {
  if (x+w <= 0 || y+h <= 0) return 0;
  Fl_Region r = rstack[rstackptr];
  if (!r) return 1;
#if defined (USE_X11)
  // get rid of coordinates outside the 16-bit range the X calls take.
  if (clip_to_short(x,y,w,h)) return 0;	// clipped
  return XRectInRegion(r, x, y, w, h);
#elif defined(WIN32)
  RECT rect;
  if (Fl_Surface_Device::surface() != Fl_Display_Device::display_device()) { // in case of print context, convert coords from logical to device
    POINT pt[2] = { {x, y}, {x + w, y + h} };
    LPtoDP(fl_gc, pt, 2);
    rect.left = pt[0].x; rect.top = pt[0].y; rect.right = pt[1].x; rect.bottom = pt[1].y;
  } else {
    rect.left = x; rect.top = y; rect.right = x+w; rect.bottom = y+h;
  }
  return RectInRegion(r,&rect);
#elif defined(__APPLE_QUARTZ__)
  CGRect arg = fl_cgrectmake_cocoa(x, y, w, h);
  for (int i = 0; i < r->count; i++) {
    CGRect test = CGRectIntersection(r->rects[i], arg);
    if (!CGRectIsEmpty(test)) return 1;
  }
  return 0;
#else
# error unsupported platform
#endif
}